

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>
__thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::
iterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::Literal*,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
          (SubstitutionTree<Indexing::LiteralClause> *this,Literal *query,bool retrieveSubstitutions
          ,bool reversed,AbstractingUnifier *args,AbstractionOracle args_1,bool args_2)

{
  bool bVar1;
  Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_RSI;
  IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_> *in_RDI;
  AbstractingUnifier *in_R9;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined5 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar2;
  Node *in_stack_ffffffffffffffa8;
  SubstitutionTree<Indexing::LiteralClause> *in_stack_ffffffffffffffb0;
  Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_ffffffffffffffb8;
  AbstractionOracle in_stack_ffffffffffffffc4;
  
  bVar1 = isEmpty((SubstitutionTree<Indexing::LiteralClause> *)
                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  uVar2 = 0;
  in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 & 0xffffff;
  if (bVar1) {
    Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>
    ::getEmpty();
  }
  else {
    Lib::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
    ::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>*,Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*,Kernel::Literal*,bool,bool,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (Literal *)
               (CONCAT44(in_stack_00000008,in_stack_ffffffffffffffa0) & 0xffffffff00ffffff),
               (bool)in_stack_ffffffffffffff9f,(bool)in_stack_ffffffffffffff9e,in_R9,
               in_stack_ffffffffffffffc4,(bool)in_stack_ffffffffffffff9d);
    uVar2 = 0x1000000;
    Lib::
    iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
              (in_RSI);
    in_stack_ffffffffffffff90 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
    Lib::
    pvi<Lib::IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>>>
              ((IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
                *)CONCAT17(in_stack_ffffffffffffff9f,
                           CONCAT16(in_stack_ffffffffffffff9e,
                                    CONCAT15(in_stack_ffffffffffffff9d,in_stack_ffffffffffffff98))))
    ;
  }
  if ((in_stack_ffffffffffffff90 & 0x1000000) != 0) {
    Lib::
    IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
    ::~IterTraits((IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
                   *)0x32a928);
  }
  if ((uVar2 & 0x1000000) != 0) {
    Lib::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  return (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>
          )in_RDI;
}

Assistant:

auto iterator(TermOrLit query, bool retrieveSubstitutions, bool reversed, Args... args)
  { return isEmpty() ? VirtualIterator<ELEMENT_TYPE(I)>::getEmpty()
                     : pvi(iterPointer(Recycled<I>(this, _root, query, retrieveSubstitutions, reversed, std::move(args)...)));
  }